

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getTimeCanonicalRepresentation(XMLDateTime *this,MemoryManager *memMgr)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *target;
  MemoryManager *local_60;
  XMLCh *local_50;
  XMLCh *retPtr;
  XMLCh *retBuf;
  MemoryManager *toUse;
  XMLSize_t XStack_30;
  int utcSize;
  XMLSize_t miliSecondsLen;
  XMLCh *miliEndPtr;
  XMLCh *miliStartPtr;
  MemoryManager *memMgr_local;
  XMLDateTime *this_local;
  
  miliStartPtr = (XMLCh *)memMgr;
  memMgr_local = (MemoryManager *)this;
  searchMiliSeconds(this,&miliEndPtr,(XMLCh **)&miliSecondsLen);
  XStack_30 = (long)(miliSecondsLen - (long)miliEndPtr) >> 1;
  toUse._4_4_ = (uint)(this->fValue[7] != 0);
  if (miliStartPtr == (XMLCh *)0x0) {
    local_60 = this->fMemoryManager;
  }
  else {
    local_60 = (MemoryManager *)miliStartPtr;
  }
  retBuf = (XMLCh *)local_60;
  iVar1 = (*local_60->_vptr_MemoryManager[3])
                    (local_60,(XStack_30 + (long)(int)toUse._4_4_ + 0xb) * 2);
  local_50 = (XMLCh *)CONCAT44(extraout_var,iVar1);
  retPtr = local_50;
  fillString(this,&local_50,this->fValue[3],2);
  if (this->fValue[3] == 0x18) {
    local_50[-2] = L'0';
    local_50[-1] = L'0';
  }
  *local_50 = L':';
  local_50 = local_50 + 1;
  fillString(this,&local_50,this->fValue[4],2);
  *local_50 = L':';
  local_50 = local_50 + 1;
  fillString(this,&local_50,this->fValue[5],2);
  if (XStack_30 != 0) {
    target = local_50 + 1;
    *local_50 = L'.';
    local_50 = target;
    XMLString::copyNString(target,miliEndPtr,XStack_30);
    local_50 = local_50 + XStack_30;
  }
  if (toUse._4_4_ != 0) {
    *local_50 = L'Z';
    local_50 = local_50 + 1;
  }
  *local_50 = L'\0';
  return retPtr;
}

Assistant:

XMLCh* XMLDateTime::getTimeCanonicalRepresentation(MemoryManager* const memMgr) const
{
    XMLCh *miliStartPtr, *miliEndPtr;
    searchMiliSeconds(miliStartPtr, miliEndPtr);
    XMLSize_t miliSecondsLen = miliEndPtr - miliStartPtr;
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (10 + miliSecondsLen + utcSize + 1) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    // 'hh:mm:ss'Z'    ('.'s+)?
    //      8    1
    //

    fillString(retPtr, fValue[Hour], 2);
    if (fValue[Hour] == 24)
    {
        *(retPtr - 2) = chDigit_0;
        *(retPtr - 1) = chDigit_0;
    }
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Minute], 2);
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Second], 2);

    if (miliSecondsLen)
    {
        *retPtr++ = chPeriod;
        XMLString::copyNString(retPtr, miliStartPtr, miliSecondsLen);
        retPtr += miliSecondsLen;
    }

    if (utcSize)
        *retPtr++ = UTC_STD_CHAR;
    *retPtr = chNull;

    return retBuf;
}